

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetGlobalGenerator(cmake *this,cmGlobalGenerator *gg)

{
  bool bVar1;
  ulong uVar2;
  allocator local_39;
  undefined1 local_38 [8];
  string env;
  cmGlobalGenerator *gg_local;
  cmake *this_local;
  
  env.field_2._8_8_ = gg;
  if (gg == (cmGlobalGenerator *)0x0) {
    cmSystemTools::Error
              ("Error SetGlobalGenerator called with null",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_38,"CC=",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_38,(string *)&this->CCEnvironment);
      }
      cmsys::SystemTools::PutEnv((string *)local_38);
      std::__cxx11::string::operator=((string *)local_38,"CXX=");
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_38,(string *)&this->CXXEnvironment);
      }
      cmsys::SystemTools::PutEnv((string *)local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
    this->GlobalGenerator = (cmGlobalGenerator *)env.field_2._8_8_;
    bVar1 = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
    cmSystemTools::SetForceUnixPaths(bVar1);
    bVar1 = cmsys::SystemTools::GetEnv("CXX",&this->CXXEnvironment);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)&this->CXXEnvironment,"");
    }
    bVar1 = cmsys::SystemTools::GetEnv("CC",&this->CCEnvironment);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)&this->CCEnvironment,"");
    }
  }
  return;
}

Assistant:

void cmake::SetGlobalGenerator(cmGlobalGenerator* gg)
{
  if (!gg) {
    cmSystemTools::Error("Error SetGlobalGenerator called with null");
    return;
  }
  // delete the old generator
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    // restore the original environment variables CXX and CC
    // Restore CC
    std::string env = "CC=";
    if (!this->CCEnvironment.empty()) {
      env += this->CCEnvironment;
    }
    cmSystemTools::PutEnv(env);
    env = "CXX=";
    if (!this->CXXEnvironment.empty()) {
      env += this->CXXEnvironment;
    }
    cmSystemTools::PutEnv(env);
  }

  // set the new
  this->GlobalGenerator = gg;

  // set the global flag for unix style paths on cmSystemTools as soon as
  // the generator is set.  This allows gmake to be used on windows.
  cmSystemTools::SetForceUnixPaths(this->GlobalGenerator->GetForceUnixPaths());

  // Save the environment variables CXX and CC
  if (!cmSystemTools::GetEnv("CXX", this->CXXEnvironment)) {
    this->CXXEnvironment = "";
  }
  if (!cmSystemTools::GetEnv("CC", this->CCEnvironment)) {
    this->CCEnvironment = "";
  }
}